

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

char mpc_input_getc(mpc_input_t *i)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  
  iVar3 = i->type;
  if (iVar3 == 2) {
    pcVar1 = i->buffer;
    if ((pcVar1 != (char *)0x0) && (iVar3 = mpc_input_buffer_in_range(i), iVar3 != 0)) {
      return pcVar1[(i->state).pos - i->marks->pos];
    }
    iVar3 = getc((FILE *)i->file);
    cVar2 = (char)iVar3;
  }
  else if (iVar3 == 1) {
    iVar3 = fgetc((FILE *)i->file);
    cVar2 = (char)iVar3;
  }
  else if (iVar3 == 0) {
    cVar2 = i->string[(i->state).pos];
  }
  else {
    cVar2 = '\0';
  }
  return cVar2;
}

Assistant:

static char mpc_input_getc(mpc_input_t *i) {

  char c = '\0';

  switch (i->type) {

    case MPC_INPUT_STRING: return i->string[i->state.pos];
    case MPC_INPUT_FILE: c = fgetc(i->file); return c;
    case MPC_INPUT_PIPE:

      if (!i->buffer) { c = getc(i->file); return c; }

      if (i->buffer && mpc_input_buffer_in_range(i)) {
        c = mpc_input_buffer_get(i);
        return c;
      } else {
        c = getc(i->file);
        return c;
      }

    default: return c;
  }
}